

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalculateProbability.cc
# Opt level: O1

JointProbabilityState *
calculateJointProbability
          (JointProbabilityState *__return_storage_ptr__,uint *firstVector,uint *secondVector,
          int vectorLength)

{
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  __ptr = calloc(6,4);
  __ptr_00 = calloc(6,4);
  __ptr_01 = calloc(0x24,4);
  pdVar7 = (double *)calloc(6,8);
  pdVar8 = (double *)calloc(6,8);
  pdVar9 = (double *)calloc(0x24,8);
  if (0 < vectorLength) {
    uVar11 = 0;
    do {
      uVar3 = firstVector[uVar11];
      piVar1 = (int *)((long)__ptr + (ulong)uVar3 * 4);
      *piVar1 = *piVar1 + 1;
      uVar4 = secondVector[uVar11];
      piVar1 = (int *)((long)__ptr_00 + (ulong)uVar4 * 4);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)((long)__ptr_01 + (ulong)(uVar3 + uVar4 * 6) * 4);
      *piVar1 = *piVar1 + 1;
      uVar11 = uVar11 + 1;
    } while ((uint)vectorLength != uVar11);
  }
  dVar12 = (double)vectorLength;
  lVar10 = 0;
  do {
    uVar2 = *(undefined8 *)((long)__ptr + lVar10 * 4);
    auVar13._0_8_ = (double)(int)uVar2;
    auVar13._8_8_ = (double)(int)((ulong)uVar2 >> 0x20);
    auVar14._8_8_ = dVar12;
    auVar14._0_8_ = dVar12;
    auVar14 = divpd(auVar13,auVar14);
    *(undefined1 (*) [16])(pdVar7 + lVar10) = auVar14;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  lVar10 = 0;
  do {
    uVar2 = *(undefined8 *)((long)__ptr_00 + lVar10 * 4);
    auVar15._0_8_ = (double)(int)uVar2;
    auVar15._8_8_ = (double)(int)((ulong)uVar2 >> 0x20);
    auVar5._8_8_ = dVar12;
    auVar5._0_8_ = dVar12;
    auVar14 = divpd(auVar15,auVar5);
    *(undefined1 (*) [16])(pdVar8 + lVar10) = auVar14;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  lVar10 = 0;
  do {
    uVar2 = *(undefined8 *)((long)__ptr_01 + lVar10 * 4);
    auVar16._0_8_ = (double)(int)uVar2;
    auVar16._8_8_ = (double)(int)((ulong)uVar2 >> 0x20);
    auVar6._8_8_ = dVar12;
    auVar6._0_8_ = dVar12;
    auVar14 = divpd(auVar16,auVar6);
    *(undefined1 (*) [16])(pdVar9 + lVar10) = auVar14;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0x24);
  __return_storage_ptr__->jointProbabilityVector = pdVar9;
  __return_storage_ptr__->numJointStates = 0x24;
  __return_storage_ptr__->firstProbabilityVector = pdVar7;
  __return_storage_ptr__->numFirstStates = 6;
  __return_storage_ptr__->secondProbabilityVector = pdVar8;
  __return_storage_ptr__->numSecondStates = 6;
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return __return_storage_ptr__;
}

Assistant:

JointProbabilityState calculateJointProbability(uint *firstVector, uint *secondVector, int vectorLength) {

  int firstNumStates = 6;
  int  secondNumStates = 6;
  int jointNumStates = firstNumStates * secondNumStates;
  
  int *firstStateCounts = (int *) calloc(firstNumStates,sizeof(int));
  int *secondStateCounts = (int *) calloc(secondNumStates,sizeof(int));
  int *jointStateCounts = (int *) calloc(jointNumStates,sizeof(int));
  
  double *firstStateProbs = (double *) calloc(firstNumStates,sizeof(double));
  double *secondStateProbs = (double *) calloc(secondNumStates,sizeof(double));
  double *jointStateProbs = (double *) calloc(jointNumStates,sizeof(double));
    
  /* Optimised for number of FP operations now O(states) instead of O(vectorLength) */
  for (int i = 0; i < vectorLength; ++i) {
    firstStateCounts[firstVector[i]] += 1;
    secondStateCounts[secondVector[i]] += 1;
    jointStateCounts[secondVector[i] * firstNumStates + firstVector[i]] += 1;
  }
  
  double length = vectorLength;
  for (int i = 0; i < firstNumStates; ++i) {
    firstStateProbs[i] = firstStateCounts[i] / length;
  }
  
  for (int i = 0; i < secondNumStates; i++) {
    secondStateProbs[i] = secondStateCounts[i] / length;
  }
  
  for (int i = 0; i < jointNumStates; i++) {
    jointStateProbs[i] = jointStateCounts[i] / length;
  }
  
  JointProbabilityState state;
  state.jointProbabilityVector = jointStateProbs;
  state.numJointStates = jointNumStates;
  state.firstProbabilityVector = firstStateProbs;
  state.numFirstStates = firstNumStates;
  state.secondProbabilityVector = secondStateProbs;
  state.numSecondStates = secondNumStates;
  
  free(firstStateCounts);
  free(secondStateCounts);
  free(jointStateCounts);

  return state;
}